

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

void __thiscall CS248::DynamicScene::Mesh::downsample(Mesh *this)

{
  Scene *pSVar1;
  XFormWidget *pXVar2;
  
  MeshResampler::downsample((MeshResampler *)&this->field_0x1f0,&this->mesh);
  pSVar1 = (this->super_SceneObject).scene;
  (pSVar1->selected).coordinates.z = 0.0;
  (pSVar1->selected).coordinates.x = 0.0;
  (pSVar1->selected).coordinates.y = 0.0;
  (pSVar1->selected).object = (SceneObject *)0x0;
  (pSVar1->selected).element = (HalfedgeElement *)0x0;
  (pSVar1->selected).axis = None;
  pSVar1 = (this->super_SceneObject).scene;
  (pSVar1->hovered).coordinates.z = 0.0;
  (pSVar1->hovered).coordinates.x = 0.0;
  (pSVar1->hovered).coordinates.y = 0.0;
  (pSVar1->hovered).object = (SceneObject *)0x0;
  (pSVar1->hovered).element = (HalfedgeElement *)0x0;
  (pSVar1->hovered).axis = None;
  pXVar2 = ((this->super_SceneObject).scene)->elementTransform;
  (pXVar2->target).coordinates.z = 0.0;
  (pXVar2->target).coordinates.x = 0.0;
  (pXVar2->target).coordinates.y = 0.0;
  (pXVar2->target).object = (SceneObject *)0x0;
  (pXVar2->target).element = (HalfedgeElement *)0x0;
  (pXVar2->target).axis = None;
  return;
}

Assistant:

void Mesh::downsample() {
  resampler.downsample(mesh);
  scene->selected.clear();
  scene->hovered.clear();
  scene->elementTransform->target.clear();
}